

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

AssertionResult * __thiscall
Catch::ExpressionResultBuilder::buildResult
          (AssertionResult *__return_storage_ptr__,ExpressionResultBuilder *this,AssertionInfo *info
          )

{
  bool bVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_118;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d8;
  string local_b8;
  string local_88 [32];
  undefined1 local_68 [8];
  AssertionResultData data;
  AssertionInfo *info_local;
  ExpressionResultBuilder *this_local;
  
  data._64_8_ = info;
  if ((this->m_data).resultType == Unknown) {
    __assert_fail("m_data.resultType != ResultWas::Unknown",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/cloderic[P]curi/tests/catch/catch.hpp"
                  ,0x1453,
                  "AssertionResult Catch::ExpressionResultBuilder::buildResult(const AssertionInfo &) const"
                 );
  }
  AssertionResultData::AssertionResultData((AssertionResultData *)local_68,&this->m_data);
  if ((((this->m_exprComponents).shouldNegate & 1U) == 0) || (data.message.field_2._8_4_ != 0)) {
    if ((((this->m_exprComponents).shouldNegate & 1U) != 0) && (data.message.field_2._8_4_ == 0x11))
    {
      data.message.field_2._8_4_ = 0;
    }
  }
  else {
    data.message.field_2._8_4_ = 0x11;
  }
  std::__cxx11::ostringstream::str();
  std::__cxx11::string::operator=
            ((string *)(data.reconstructedExpression.field_2._M_local_buf + 8),local_88);
  std::__cxx11::string::~string(local_88);
  reconstructExpression_abi_cxx11_(&local_b8,this,(AssertionInfo *)data._64_8_);
  std::__cxx11::string::operator=((string *)local_68,(string *)&local_b8);
  std::__cxx11::string::~string((string *)&local_b8);
  if (((this->m_exprComponents).shouldNegate & 1U) != 0) {
    bVar1 = std::operator==(&(this->m_exprComponents).op,"");
    if (bVar1) {
      std::operator+(&local_d8,"!",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_68);
      std::__cxx11::string::operator=((string *)local_68,(string *)&local_d8);
      std::__cxx11::string::~string((string *)&local_d8);
    }
    else {
      std::operator+(&local_118,"!(",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_68);
      std::operator+(&local_f8,&local_118,")");
      std::__cxx11::string::operator=((string *)local_68,(string *)&local_f8);
      std::__cxx11::string::~string((string *)&local_f8);
      std::__cxx11::string::~string((string *)&local_118);
    }
  }
  AssertionResult::AssertionResult
            (__return_storage_ptr__,(AssertionInfo *)data._64_8_,(AssertionResultData *)local_68);
  AssertionResultData::~AssertionResultData((AssertionResultData *)local_68);
  return __return_storage_ptr__;
}

Assistant:

AssertionResult ExpressionResultBuilder::buildResult( const AssertionInfo& info ) const
    {
        assert( m_data.resultType != ResultWas::Unknown );

        AssertionResultData data = m_data;

        // Flip bool results if shouldNegate is set
        if( m_exprComponents.shouldNegate && data.resultType == ResultWas::Ok )
            data.resultType = ResultWas::ExpressionFailed;
        else if( m_exprComponents.shouldNegate && data.resultType == ResultWas::ExpressionFailed )
            data.resultType = ResultWas::Ok;

        data.message = m_stream.str();
        data.reconstructedExpression = reconstructExpression( info );
        if( m_exprComponents.shouldNegate ) {
            if( m_exprComponents.op == "" )
                data.reconstructedExpression = "!" + data.reconstructedExpression;
            else
                data.reconstructedExpression = "!(" + data.reconstructedExpression + ")";
        }
        return AssertionResult( info, data );
    }